

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

bool death_prog_barbas(CHAR_DATA *mob,CHAR_DATA *killer)

{
  PC_DATA *pPVar1;
  int iVar2;
  AFFECT_DATA *pAVar3;
  bool bVar4;
  
  pAVar3 = affect_find(mob->affected,(int)gsn_lesser_demon);
  if (pAVar3 == (AFFECT_DATA *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    act("Emitting a ghastly grunt, Barbas falls to the ground in a heap and disappears.",mob,
        (void *)0x0,(void *)0x0,0);
    if (pAVar3->owner == killer) {
      send_to_char("You feel a gluttonous lust enter your body as you stand victorious!\n\r",killer)
      ;
      pPVar1 = killer->pcdata;
      pPVar1->lesserdata[0] = 2;
      iVar2 = skill_lookup("consume");
      pPVar1->learned[iVar2] = 1;
      extract_char(mob,true);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool death_prog_barbas(CHAR_DATA *mob, CHAR_DATA *killer)
{
	AFFECT_DATA *af;

	af = affect_find(mob->affected, gsn_lesser_demon);
	if (!af)
		return false;

	act("Emitting a ghastly grunt, Barbas falls to the ground in a heap and disappears.", mob, 0, 0, TO_ROOM);

	if (killer != af->owner)
		return false;

	send_to_char("You feel a gluttonous lust enter your body as you stand victorious!\n\r", killer);

	killer->pcdata->lesserdata[LESSER_BARBAS] = FAVOR_GRANTED;
	killer->pcdata->learned[skill_lookup("consume")] = 1;

	extract_char(mob, true);

	return true;
}